

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void __thiscall SFFile::CheckZones(SFFile *this,int start,int stop,bool instr)

{
  SFBag *pSVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  SFGenerator SVar6;
  SFBag *pSVar7;
  SFGenList *pSVar8;
  SFGenerator SVar9;
  undefined3 in_register_00000009;
  uchar temp;
  int i;
  long lVar10;
  SFBag **ppSVar11;
  SFGenList **ppSVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  
  bVar15 = CONCAT31(in_register_00000009,instr) != 0;
  SVar9 = 0x29;
  ppSVar12 = &this->PresetGenerators;
  if (bVar15) {
    SVar9 = 0x35;
    ppSVar12 = &this->InstrGenerators;
  }
  ppSVar11 = &this->InstrBags;
  if (!bVar15) {
    ppSVar11 = &this->PresetBags;
  }
  if (start < stop) {
    pSVar7 = *ppSVar11;
    pSVar8 = *ppSVar12;
    lVar10 = (long)start;
    lVar13 = lVar10;
    do {
      pSVar1 = pSVar7 + lVar13;
      uVar4 = pSVar1->GenIndex;
      uVar14 = (ulong)uVar4;
      uVar5 = pSVar1[1].GenIndex;
      if (uVar5 < uVar4) {
        (pSVar1->KeyRange).Lo = 0xff;
        (pSVar1->KeyRange).Hi = 0xff;
        (pSVar1->VelRange).Lo = 0xff;
        (pSVar1->VelRange).Hi = 0xff;
      }
      else {
        if ((lVar13 != lVar10) && (pSVar7[lVar10].Target < 0)) {
          pSVar1->KeyRange = pSVar7[lVar10].KeyRange;
          pSVar1->VelRange = pSVar7[lVar10].VelRange;
        }
        if (uVar4 < uVar5) {
          do {
            SVar6 = pSVar8[uVar14].Oper;
            if (SVar6 == 0x2c) {
              pSVar1->VelRange = (SFRange)pSVar8[uVar14].field_1;
            }
            else if (SVar6 == 0x2b) {
              pSVar1->KeyRange = (SFRange)pSVar8[uVar14].field_1;
            }
            else if (SVar9 == SVar6) {
              if (instr) {
LAB_00350f80:
                uVar4 = pSVar8[uVar14].field_1.uAmount;
                if (this->NumSamples + -1 <= (int)(uint)uVar4) break;
              }
              else {
                uVar4 = pSVar8[uVar14].field_1.uAmount;
                if (this->NumInstruments + -1 <= (int)(uint)uVar4) {
                  if (instr) goto LAB_00350f80;
                  break;
                }
              }
              pSVar1->Target = (uint)uVar4;
              break;
            }
            uVar14 = uVar14 + 1;
          } while (uVar5 != uVar14);
        }
        if ((lVar13 != lVar10) && (pSVar1->Target < 0)) {
          (pSVar1->KeyRange).Lo = 0xff;
          (pSVar1->KeyRange).Hi = 0xff;
          (pSVar1->VelRange).Lo = 0xff;
          (pSVar1->VelRange).Hi = 0xff;
        }
        bVar2 = (pSVar1->KeyRange).Lo;
        bVar3 = (pSVar1->KeyRange).Hi;
        if (bVar3 < bVar2) {
          (pSVar1->KeyRange).Lo = bVar3;
          (pSVar1->KeyRange).Hi = bVar2;
        }
        bVar2 = (pSVar1->VelRange).Lo;
        bVar3 = (pSVar1->VelRange).Hi;
        if (bVar3 < bVar2) {
          (pSVar1->VelRange).Lo = bVar3;
          (pSVar1->VelRange).Hi = bVar2;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != stop);
  }
  return;
}

Assistant:

void SFFile::CheckZones(int start, int stop, bool instr)
{
	SFBag *bag;
	SFGenList *gens;
	SFGenerator terminal_gen;
	int zone_start, zone_stop;
	int i, j;

	if (!instr)
	{
		bag = PresetBags;
		gens = PresetGenerators;
		terminal_gen = GEN_instrument;
	}
	else
	{
		bag = InstrBags;
		gens = InstrGenerators;
		terminal_gen = GEN_sampleID;
	}
	for (i = start; i < stop; ++i)
	{
		zone_start = bag[i].GenIndex;
		zone_stop = bag[i + 1].GenIndex;

		if (zone_start > zone_stop)
		{
			// Skip empty zones, and mark them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
			continue;
		}

		// According to the specs, if keyRange is present, it must be the first generator.
		// If velRange is present, it may only be preceded by keyRange. In real life, there
		// exist Soundfonts that violate this rule, so we need to scan every generator.

		// Preload ranges from the global zone.
		if (i != start && bag[start].Target < 0)
		{
			bag[i].KeyRange = bag[start].KeyRange;
			bag[i].VelRange = bag[start].VelRange;
		}
		for (j = zone_start; j < zone_stop; ++j)
		{
			if (gens[j].Oper == GEN_keyRange)
			{
				bag[i].KeyRange = gens[j].Range;
			}
			else if (gens[j].Oper == GEN_velRange)
			{
				bag[i].VelRange = gens[j].Range;
			}
			else if (gens[j].Oper == terminal_gen)
			{
				if (terminal_gen == GEN_instrument && gens[j].uAmount < NumInstruments - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				else if (terminal_gen == GEN_sampleID && gens[j].uAmount < NumSamples - 1)
				{
					bag[i].Target = gens[j].uAmount;
				}
				break;
			}
		}
		if (bag[i].Target < 0 && i != start)
		{
			// Only the first zone may be targetless. If any other zones are,
			// make them inaccessible.
			bag[i].KeyRange.Lo = 255;
			bag[i].KeyRange.Hi = 255;
			bag[i].VelRange.Lo = 255;
			bag[i].VelRange.Hi = 255;
		}

		// Check for swapped ranges. (Should we fix them or ignore them?)
		if (bag[i].KeyRange.Lo > bag[i].KeyRange.Hi)
		{
			swapvalues(bag[i].KeyRange.Lo, bag[i].KeyRange.Hi);
		}
		if (bag[i].VelRange.Lo > bag[i].VelRange.Hi)
		{
			swapvalues(bag[i].VelRange.Lo, bag[i].VelRange.Hi);
		}
	}
}